

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_partition_tables.cpp
# Opt level: O2

void build_partition_table_for_one_partition_count
               (block_size_descriptor *bsd,bool can_omit_partitionings,uint partition_count_cutoff,
               uint partition_count,partition_info *ptab,uint64_t *canonical_patterns)

{
  uint64_t *puVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  uint partition_remap_index;
  undefined7 in_register_00000031;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  uint i;
  long lVar13;
  uint x;
  int iVar14;
  int mapped_index [4];
  uint8_t build [1024];
  
  uVar6 = partition_count - 1;
  bsd->partitioning_count_selected[uVar6] = 0;
  bsd->partitioning_count_all[uVar6] = 0;
  if ((int)CONCAT71(in_register_00000031,can_omit_partitionings) == 0) {
    iVar4 = 2;
  }
  else {
    if (partition_count_cutoff < partition_count) {
      return;
    }
    iVar4 = 1;
  }
  iVar14 = 0;
  memset(build,0,0x400);
  partition_remap_index = 0;
  do {
    if (iVar14 == iVar4) {
      return;
    }
    for (lVar13 = 0; lVar13 != 0x400; lVar13 = lVar13 + 1) {
      if ((iVar14 != 1) || (build[lVar13] == '\0')) {
        uVar12 = (ulong)partition_remap_index;
        bVar5 = generate_one_partition_info_entry
                          (bsd,partition_count,(uint)lVar13,partition_remap_index,ptab + uVar12);
        if ((iVar14 != 0) || (bVar5)) {
          bVar2 = bsd->texel_count;
          puVar1 = canonical_patterns + partition_remap_index * 7;
          for (lVar8 = 0; lVar8 != 7; lVar8 = lVar8 + 1) {
            puVar1[lVar8] = 0;
          }
          for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
            mapped_index[lVar8] = -1;
          }
          iVar11 = 0;
          for (uVar10 = 0; uVar10 != bVar2; uVar10 = uVar10 + 1) {
            bVar3 = ptab[uVar12].partition_of_texel[uVar10];
            iVar7 = mapped_index[bVar3];
            if (mapped_index[bVar3] < 0) {
              mapped_index[bVar3] = iVar11;
              iVar7 = iVar11;
              iVar11 = iVar11 + 1;
            }
            puVar1[uVar10 >> 5 & 0x7ffffff] =
                 puVar1[uVar10 >> 5 & 0x7ffffff] | (long)iVar7 << ((char)uVar10 * '\x02' & 0x3fU);
          }
          uVar10 = 0;
          while ((uVar10 != uVar12 &&
                 ((((uVar9 = (ulong)(uint)((int)uVar10 * 7), *puVar1 != canonical_patterns[uVar9] ||
                    (puVar1[1] != canonical_patterns[uVar9 + 1])) ||
                   (puVar1[2] != canonical_patterns[uVar9 + 2])) ||
                  (((puVar1[3] != canonical_patterns[uVar9 + 3] ||
                    (puVar1[4] != canonical_patterns[uVar9 + 4])) ||
                   ((puVar1[5] != canonical_patterns[uVar9 + 5] ||
                    (puVar1[6] != canonical_patterns[uVar9 + 6]))))))))) {
            uVar10 = uVar10 + 1;
          }
          if (bVar5 && uVar12 <= uVar10) {
            if (iVar14 == 0) {
              bsd->partitioning_packed_index[partition_count - 2][lVar13] =
                   (uint16_t)partition_remap_index;
              bsd->partitioning_count_selected[uVar6] = bsd->partitioning_count_selected[uVar6] + 1;
              bsd->partitioning_count_all[uVar6] = bsd->partitioning_count_all[uVar6] + 1;
              build[lVar13] = '\x01';
LAB_0025d972:
              partition_remap_index = partition_remap_index + 1;
            }
          }
          else if (iVar14 == 1) {
            bsd->partitioning_packed_index[partition_count - 2][lVar13] =
                 (uint16_t)partition_remap_index;
            bsd->partitioning_count_all[uVar6] = bsd->partitioning_count_all[uVar6] + 1;
            goto LAB_0025d972;
          }
        }
      }
    }
    iVar14 = iVar14 + 1;
  } while( true );
}

Assistant:

static void build_partition_table_for_one_partition_count(
	block_size_descriptor& bsd,
	bool can_omit_partitionings,
	unsigned int partition_count_cutoff,
	unsigned int partition_count,
	partition_info* ptab,
	uint64_t* canonical_patterns
) {
	unsigned int next_index = 0;
	bsd.partitioning_count_selected[partition_count - 1] = 0;
	bsd.partitioning_count_all[partition_count - 1] = 0;

	// Skip tables larger than config max partition count if we can omit modes
	if (can_omit_partitionings && (partition_count > partition_count_cutoff))
	{
		return;
	}

	// Iterate through twice
	//   - Pass 0: Keep selected partitionings
	//   - Pass 1: Keep non-selected partitionings (skip if in omit mode)
	unsigned int max_iter = can_omit_partitionings ? 1 : 2;

	// Tracker for things we built in the first iteration
	uint8_t build[BLOCK_MAX_PARTITIONINGS] { 0 };
	for (unsigned int x = 0; x < max_iter; x++)
	{
		for (unsigned int i = 0; i < BLOCK_MAX_PARTITIONINGS; i++)
		{
			// Don't include things we built in the first pass
			if ((x == 1) && build[i])
			{
				continue;
			}

			bool keep_useful = generate_one_partition_info_entry(bsd, partition_count, i, next_index, ptab[next_index]);
			if ((x == 0) && !keep_useful)
			{
				continue;
			}

			generate_canonical_partitioning(bsd.texel_count, ptab[next_index].partition_of_texel, canonical_patterns + next_index * BIT_PATTERN_WORDS);
			bool keep_canonical = true;
			for (unsigned int j = 0; j < next_index; j++)
			{
				bool match = compare_canonical_partitionings(canonical_patterns + next_index * BIT_PATTERN_WORDS, canonical_patterns +  j * BIT_PATTERN_WORDS);
				if (match)
				{
					keep_canonical = false;
					break;
				}
			}

			if (keep_useful && keep_canonical)
			{
				if (x == 0)
				{
					bsd.partitioning_packed_index[partition_count - 2][i] = static_cast<uint16_t>(next_index);
					bsd.partitioning_count_selected[partition_count - 1]++;
					bsd.partitioning_count_all[partition_count - 1]++;
					build[i] = 1;
					next_index++;
				}
			}
			else
			{
				if (x == 1)
				{
					bsd.partitioning_packed_index[partition_count - 2][i] = static_cast<uint16_t>(next_index);
					bsd.partitioning_count_all[partition_count - 1]++;
					next_index++;
				}
			}
		}
	}
}